

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.hpp
# Opt level: O3

void __thiscall Tree::createWeightArray(Tree *this)

{
  short sVar1;
  Node **ppNVar2;
  iterator __position;
  long lVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  int currWeight;
  int local_24;
  
  iVar5 = 0;
  quickSort(this,0,this->m_queueIndexArraySize + -1);
  iVar4 = this->m_queueIndexArraySize;
  if (0 < iVar4) {
    do {
      local_24 = 1;
      if (iVar5 != iVar4 + -1) {
        ppNVar2 = this->m_queueIndexArray;
        lVar7 = (long)iVar5;
        sVar1 = (ppNVar2[lVar7]->field_1).data.year;
        if (sVar1 == (ppNVar2[lVar7 + 1]->field_1).data.year) {
          local_24 = iVar4 - iVar5;
          lVar6 = 1;
          do {
            if ((long)iVar4 - (lVar7 + 1) == lVar6) goto LAB_0010424b;
            lVar3 = lVar7 + 1 + lVar6;
            lVar6 = lVar6 + 1;
          } while (sVar1 == (ppNVar2[lVar3]->field_1).data.year);
          local_24 = (int)lVar6;
        }
      }
LAB_0010424b:
      __position._M_current =
           (this->m_weightArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (this->m_weightArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)&this->m_weightArray,__position,&local_24);
      }
      else {
        *__position._M_current = local_24;
        (this->m_weightArray).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      iVar5 = iVar5 + local_24;
      iVar4 = this->m_queueIndexArraySize;
    } while (iVar5 < iVar4);
  }
  return;
}

Assistant:

void createWeightArray() {
        quickSort(0, m_queueIndexArraySize - 1);
        int currWeight = 1;
        for (int i = 0; i < m_queueIndexArraySize; ++i) {
            if ((i != m_queueIndexArraySize - 1) && (m_queueIndexArray[i]->data.year == m_queueIndexArray[i + 1]->data.year)) {
                currWeight++;
                int j = i + 1;
                while ((j != m_queueIndexArraySize - 1) && (m_queueIndexArray[j]->data.year == m_queueIndexArray[j + 1]->data.year)) {
                    currWeight++;
                    j++;
                }
            }
            m_weightArray.push_back(currWeight);
            i += currWeight - 1;
            currWeight = 1;
        }
    }